

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

int __thiscall
QAccessibleAbstractScrollArea::indexOfChild
          (QAccessibleAbstractScrollArea *this,QAccessibleInterface *child)

{
  long lVar1;
  QWidget *pQVar2;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QWidget *local_40;
  QArrayDataPointer<QWidget_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -1;
  if ((child != (QAccessibleInterface *)0x0) &&
     (lVar1 = (**(code **)(*(long *)child + 0x18))(child), lVar1 != 0)) {
    accessibleChildren((QWidgetList *)&local_38,this);
    pQVar2 = (QWidget *)(**(code **)(*(long *)child + 0x18))(child);
    if (pQVar2 == (QWidget *)0x0) {
      local_40 = (QWidget *)0x0;
    }
    else {
      local_40 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0) {
        local_40 = pQVar2;
      }
    }
    qVar3 = QtPrivate::indexOf<QWidget*,QWidget*>((QList<QWidget_*> *)&local_38,&local_40,0);
    iVar4 = (int)qVar3;
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QAccessibleAbstractScrollArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object())
        return -1;
    return accessibleChildren().indexOf(qobject_cast<QWidget *>(child->object()));
}